

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

void __thiscall QtMWidgets::TableViewCell::paintEvent(TableViewCell *this,QPaintEvent *e)

{
  TableViewCellPrivate *pTVar1;
  QRect QVar2;
  QPainter p;
  QRect local_20;
  
  QWidget::paintEvent((QPaintEvent *)this);
  pTVar1 = (this->d).d;
  if ((pTVar1->clicked == true) && (pTVar1->highlightOnClick == true)) {
    QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
    QPainter::setPen((QColor *)&p);
    QBrush::QBrush((QBrush *)&local_20,&((this->d).d)->highlightColor,SolidPattern);
    QPainter::setBrush((QBrush *)&p);
    QBrush::~QBrush((QBrush *)&local_20);
    QVar2 = QWidget::rect(&this->super_QWidget);
    local_20._0_8_ = QVar2._0_8_;
    local_20._8_8_ = ((ulong)(QVar2.x2 - 1) | QVar2._8_8_ & 0xffffffff00000000) - 0x100000000;
    QPainter::drawRect(&p,&local_20);
    QPainter::~QPainter(&p);
  }
  return;
}

Assistant:

void
TableViewCell::paintEvent( QPaintEvent * e )
{
	QWidget::paintEvent( e );

	if( d->clicked && d->highlightOnClick )
	{
		QPainter p( this );

		p.setPen( d->highlightColor );
		p.setBrush( d->highlightColor );

		p.drawRect( rect().adjusted( 0, 0, -1, -1 ) );
	}
}